

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_checkversion_(lua_State *L,lua_Number ver,size_t sz)

{
  lua_Number lVar1;
  lua_Number v;
  size_t sz_local;
  lua_Number ver_local;
  lua_State *L_local;
  
  lVar1 = lua_version(L);
  if (sz == 0x88) {
    if ((lVar1 != ver) || (NAN(lVar1) || NAN(ver))) {
      luaL_error(L,"version mismatch: app. needs %f, Lua core provides %f",ver,lVar1);
    }
  }
  else {
    luaL_error(L,"core and library have incompatible numeric types");
  }
  return;
}

Assistant:

LUALIB_API void luaL_checkversion_ (lua_State *L, lua_Number ver, size_t sz) {
  lua_Number v = lua_version(L);
  if (sz != LUAL_NUMSIZES)  /* check numeric types */
    luaL_error(L, "core and library have incompatible numeric types");
  else if (v != ver)
    luaL_error(L, "version mismatch: app. needs %f, Lua core provides %f",
                  (LUAI_UACNUMBER)ver, (LUAI_UACNUMBER)v);
}